

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUserDefinedIO.cpp
# Opt level: O1

void __thiscall
vkt::tessellation::anon_unknown_1::IOBlock::Member::Member(Member *this,string *n,VarType *t)

{
  pointer pcVar1;
  
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (n->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + n->_M_string_length);
  glu::VarType::VarType(&this->type,t);
  return;
}

Assistant:

Member (const std::string& n, const glu::VarType& t) : name(n), type(t) {}